

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump_ossl_hash.h
# Opt level: O0

void __thiscall CryptHash::InitHash(CryptHash *this,int type)

{
  _func_int_void_ptr *p_Var1;
  bool bVar2;
  int iVar3;
  runtime_error *this_00;
  reference local_40;
  bool local_25;
  int type_local;
  CryptHash *this_local;
  
  local_25 = 6 < (uint)type;
  if (local_25) {
    __assert_fail("type>=0 && type<(int)NRHASHTYPES",
                  "/workspace/llm4binary/github/license_c_cmakelists/nlitsme[P]hexdumper/dump_ossl_hash.h"
                  ,0xba,"void CryptHash::InitHash(int)");
  }
  this->m_type = type;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_state,(long)hashdefs[this->m_type].statesize);
  p_Var1 = hashdefs[this->m_type].init;
  bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&this->m_state);
  if (bVar2) {
    local_40 = (reference)0x0;
  }
  else {
    local_40 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->m_state,0);
  }
  iVar3 = (*p_Var1)(local_40);
  if (iVar3 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"hash-init");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void InitHash(int type)
    {
        assert(type>=0 && type<(int)NRHASHTYPES);

        m_type= type;
        m_state.resize(hashdefs[m_type].statesize);
        if (!hashdefs[m_type].init(vectorptr(m_state)))
            throw std::runtime_error("hash-init");
    }